

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Parser.h
# Opt level: O0

string * __thiscall
soul::heart::Parser::readVariableIdentifier_abi_cxx11_(string *__return_storage_ptr__,Parser *this)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  undefined1 auVar2 [16];
  CompileMessage local_a8;
  CompileMessage local_60;
  char *local_28;
  undefined1 local_19;
  Parser *local_18;
  Parser *this_local;
  string *name;
  
  local_19 = 0;
  local_18 = this;
  this_local = (Parser *)__return_storage_ptr__;
  std::__cxx11::string::string
            ((string *)__return_storage_ptr__,
             (string *)
             &(this->
              super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
              ).currentStringValue);
  bVar1 = matchesAnyIdentifier(this);
  if (bVar1) {
    local_28 = "$variableIdentifier";
    bVar1 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
            ::matches(&this->
                       super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                      ,(TokenType)"$variableIdentifier");
    if (!bVar1) {
      Errors::invalidVariableName<std::__cxx11::string&>
                (&local_60,(Errors *)__return_storage_ptr__,args);
      (*(this->
        super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
        )._vptr_Tokeniser[2])(this,&local_60);
      CompileMessage::~CompileMessage(&local_60);
    }
  }
  auVar2 = std::__cxx11::string::length();
  if (auVar2._0_8_ < 2) {
    Errors::invalidVariableName<std::__cxx11::string&>
              (&local_a8,(Errors *)__return_storage_ptr__,auVar2._8_8_);
    (*(this->
      super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
      )._vptr_Tokeniser[2])(this,&local_a8);
    CompileMessage::~CompileMessage(&local_a8);
  }
  Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
  expect<soul::TokenType>
            (&this->
              super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
             ,(TokenType)"$variableIdentifier");
  return __return_storage_ptr__;
}

Assistant:

std::string readVariableIdentifier()
    {
        auto name = currentStringValue;

        if (matchesAnyIdentifier() && ! matches (Token::variableIdentifier))
            throwError (Errors::invalidVariableName (name));

        if (name.length() < 2)
            throwError (Errors::invalidVariableName (name));

        expect (Token::variableIdentifier);

        return name;
    }